

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O1

PatternGeneration * __thiscall
PatternGeneration::getPerlinNoiseTexture
          (PatternGeneration *this,int *imageSize,bool *random_colors,double *z1,double *z2,
          double *z3)

{
  size_t *this_00;
  element_type *peVar1;
  double dVar2;
  double dVar3;
  int i;
  uint uVar4;
  result_type rVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  Scalar_ *pSVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double *in_stack_00000008;
  undefined1 auStack_27d8 [8];
  random_device rd;
  undefined1 local_1448 [8];
  mt19937 mt;
  PerlinNoise pn;
  Vec<unsigned_char,_3> v;
  double dStack_68;
  Vec3d val;
  
  pSVar10 = (Scalar_ *)auStack_27d8;
  rd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  rd.field_0._M_mt._M_x[2] = 0;
  auStack_27d8 = (undefined1  [8])0x0;
  rd.field_0.field_0._M_file = (void *)0x0;
  val.super_Matx<double,_3,_1>.val[2] = (double)imageSize;
  cv::Mat::Mat((Mat *)this,*(int *)random_colors,*(int *)random_colors,0x10,pSVar10);
  PerlinNoise::PerlinNoise((PerlinNoise *)&mt._M_p);
  std::random_device::random_device((random_device *)auStack_27d8);
  uVar4 = std::random_device::_M_getval();
  iVar8 = (int)pSVar10;
  local_1448 = (undefined1  [8])(ulong)uVar4;
  lVar9 = 1;
  uVar7 = (ulong)local_1448;
  do {
    uVar7 = (ulong)(((uint)(uVar7 >> 0x1e) ^ (uint)uVar7) * 0x6c078965 + (int)lVar9);
    mt._M_x[lVar9 + -1] = uVar7;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x270);
  mt._M_x[0x26f] = 0x270;
  if (0 < *(int *)random_colors) {
    this_00 = &mt._M_p;
    lVar9 = 0;
    do {
      uVar7 = (ulong)*(uint *)random_colors;
      if (0 < (int)*(uint *)random_colors) {
        lVar11 = 0;
        do {
          dVar15 = (double)(int)lVar11 / (double)(int)uVar7;
          dVar14 = (double)(int)lVar9 / (double)(int)uVar7;
          dStack_68 = 0.0;
          val.super_Matx<double,_3,_1>.val[0] = 0.0;
          val.super_Matx<double,_3,_1>.val[1] = 0.0;
          if (*(char *)z1 == '\x01') {
            rVar5 = std::uniform_int_distribution<int>::operator()
                              (*(uniform_int_distribution<int> **)
                                val.super_Matx<double,_3,_1>.val[2],
                               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                *)local_1448,
                               &(*(uniform_int_distribution<int> **)
                                  val.super_Matx<double,_3,_1>.val[2])->_M_param);
            dVar2 = PerlinNoise::noise((PerlinNoise *)this_00,dVar15,dVar14,
                                       (double)rVar5 / 2147483647.0);
            dVar3 = floor(dVar2 * 20.0);
            dStack_68 = floor((dVar2 * 20.0 - dVar3) * 255.0);
            rVar5 = std::uniform_int_distribution<int>::operator()
                              (*(uniform_int_distribution<int> **)
                                val.super_Matx<double,_3,_1>.val[2],
                               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                *)local_1448,
                               &(*(uniform_int_distribution<int> **)
                                  val.super_Matx<double,_3,_1>.val[2])->_M_param);
            dVar2 = PerlinNoise::noise((PerlinNoise *)this_00,dVar15,dVar14,
                                       (double)rVar5 / 2147483647.0);
            dVar3 = floor(dVar2 * 20.0);
            val.super_Matx<double,_3,_1>.val[0] = floor((dVar2 * 20.0 - dVar3) * 255.0);
            rVar5 = std::uniform_int_distribution<int>::operator()
                              (*(uniform_int_distribution<int> **)
                                val.super_Matx<double,_3,_1>.val[2],
                               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                *)local_1448,
                               &(*(uniform_int_distribution<int> **)
                                  val.super_Matx<double,_3,_1>.val[2])->_M_param);
            dVar14 = PerlinNoise::noise((PerlinNoise *)this_00,dVar15,dVar14,
                                        (double)rVar5 / 2147483647.0);
            uVar12 = SUB84(dVar14,0);
            uVar13 = (undefined4)((ulong)dVar14 >> 0x20);
          }
          else {
            dVar2 = PerlinNoise::noise((PerlinNoise *)this_00,dVar15,dVar14,*z2);
            dVar3 = floor(dVar2 * 20.0);
            dStack_68 = floor((dVar2 * 20.0 - dVar3) * 255.0);
            dVar2 = PerlinNoise::noise((PerlinNoise *)this_00,dVar15,dVar14,*z3);
            dVar3 = floor(dVar2 * 20.0);
            val.super_Matx<double,_3,_1>.val[0] = floor((dVar2 * 20.0 - dVar3) * 255.0);
            dVar14 = PerlinNoise::noise((PerlinNoise *)this_00,dVar15,dVar14,*in_stack_00000008);
            uVar12 = SUB84(dVar14,0);
            uVar13 = (undefined4)((ulong)dVar14 >> 0x20);
          }
          dVar14 = (double)CONCAT44(uVar13,uVar12) * 20.0;
          dVar15 = floor(dVar14);
          val.super_Matx<double,_3,_1>.val[1] = floor((dVar14 - dVar15) * 255.0);
          pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               (uint)pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage & 0xff000000;
          lVar6 = 0;
          do {
            iVar8 = (int)ROUND(val.super_Matx<double,_3,_1>.val[lVar6 + -1]);
            if (iVar8 < 1) {
              iVar8 = 0;
            }
            if (0xfe < iVar8) {
              iVar8 = 0xff;
            }
            v.super_Matx<unsigned_char,_3,_1>.val[lVar6 + -8] = (uchar)iVar8;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          lVar6 = (long)(this[4].dist.
                         super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_vptr__Sp_counted_base * lVar9;
          peVar1 = this[1].dist.
                   super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          *(undefined1 *)((long)&(peVar1->_M_param)._M_a + lVar11 * 3 + lVar6 + 2) =
               pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._2_1_;
          *(undefined2 *)((long)&(peVar1->_M_param)._M_a + lVar11 * 3 + lVar6) =
               pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._0_2_;
          lVar11 = lVar11 + 1;
          uVar7 = (ulong)*(int *)random_colors;
        } while (lVar11 < (long)uVar7);
      }
      iVar8 = (int)pSVar10;
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)random_colors);
  }
  val.super_Matx<double,_3,_1>.val[1] = 0.0;
  dStack_68 = (double)CONCAT44(dStack_68._4_4_,0x1010000);
  pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x2010000;
  val.super_Matx<double,_3,_1>.val[0] = (double)this;
  cv::cvtColor((cv *)&dStack_68,
               (_InputArray *)
               &pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,(_OutputArray *)0x39,0,iVar8);
  std::random_device::_M_fini();
  if (mt._M_p != 0) {
    operator_delete((void *)mt._M_p);
  }
  return this;
}

Assistant:

cv::Mat PatternGeneration::getPerlinNoiseTexture(
    const int & imageSize,
    const bool & random_colors,
    const double & z1,
    const double & z2,
    const double & z3)
{
    // Create an empty PPM image
    cv::Mat image(imageSize,imageSize,CV_8UC3,cv::Scalar::all(0));
    // Create a PerlinNoise object with a random permutation vector generated with seed
    //unsigned int seed = (*dist)(mt);
    PerlinNoise pn;

    std::random_device rd;
    std::mt19937 mt(rd());

    // Visit every pixel of the image and assign a color generated with Perlin noise
    #pragma omp parallel for
    for (int i = 0; i < imageSize; ++i) {      // y
        for (int j = 0; j < imageSize; ++j) {  // x

            double x = (double)j/((double)imageSize);
            double y = (double)i/((double)imageSize);

            cv::Vec3d val;

            // Wood like structure
            if(random_colors)
            {
                // Red
                val[0] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[0] = val[0] - floor(val[0]);
                val[0] = floor(255 * val[0]);
                // Green
                val[1] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[1] = val[1] - floor(val[1]);
                val[1] = floor(255 * val[1]);
                // Blue
                val[2] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[2] = val[2] - floor(val[2]);
                val[2] = floor(255 * val[2]);

            } else {

                // Red
                val[0] = 20.0 * pn.noise(x, y, z1);
                val[0] = val[0] - floor(val[0]);
                val[0] = floor(255 * val[0]);
                // Green
                val[1] = 20.0 * pn.noise(x, y, z2);
                val[1] = val[1] - floor(val[1]);
                val[1] = floor(255 * val[1]);
                // Blue
                val[2] = 20.0 * pn.noise(x, y, z3);
                val[2] = val[2] - floor(val[2]);
                val[2] = floor(255 * val[2]);

            }
            image.at<cv::Vec3b>(i,j) = val;
        }
    }
    cvtColor(image,image,cv::COLOR_Lab2RGB); // converting back to 8U with scaling
    return image;
}